

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureMS5611.cpp
# Opt level: O2

bool __thiscall RTPressureMS5611::pressureInit(RTPressureMS5611 *this)

{
  bool bVar1;
  undefined8 in_RAX;
  ulong uVar2;
  uchar regAddr;
  undefined8 uStack_38;
  uchar data [2];
  
  this->m_pressureAddr = ((this->super_RTPressure).m_settings)->m_I2CPressureAddress;
  regAddr = 0xa2;
  uStack_38 = in_RAX;
  for (uVar2 = 0; uVar2 != 6; uVar2 = uVar2 + 1) {
    bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                              this->m_pressureAddr,regAddr,'\x02',data,
                              "Failed to read MS5611 calibration data");
    if (!bVar1) goto LAB_0011c23a;
    this->m_calData[uVar2] = (short)data << 8 | (ushort)data >> 8;
    regAddr = regAddr + '\x02';
  }
  this->m_state = 0;
LAB_0011c23a:
  return 5 < uVar2;
}

Assistant:

bool RTPressureMS5611::pressureInit()
{
    unsigned char cmd = MS5611_CMD_PROM + 2;
    unsigned char data[2];

    m_pressureAddr = m_settings->m_I2CPressureAddress;

    // get calibration data

    for (int i = 0; i < 6; i++) {
        if (!m_settings->HALRead(m_pressureAddr, cmd, 2, data, "Failed to read MS5611 calibration data"))
            return false;
        m_calData[i] = (((uint16_t)data[0]) << 8) + (uint16_t)data[1];
        // printf("Cal index: %d, data: %d\n", i, m_calData[i]);
        cmd += 2;
    }

    m_state = MS5611_STATE_IDLE;
    return true;
}